

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O0

element<tinyusdz::crate::CrateDataTypeId,_bool> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,bool>const*,mapbox::eternal::impl::compare_key<tinyusdz::crate::CrateDataTypeId>>
          (element<tinyusdz::crate::CrateDataTypeId,_bool> *left,
          element<tinyusdz::crate::CrateDataTypeId,_bool> *right,
          compare_key<tinyusdz::crate::CrateDataTypeId> *key)

{
  bool bVar1;
  less local_31;
  ulong local_30;
  size_t step;
  size_t count;
  compare_key<tinyusdz::crate::CrateDataTypeId> *key_local;
  element<tinyusdz::crate::CrateDataTypeId,_bool> *right_local;
  element<tinyusdz::crate::CrateDataTypeId,_bool> *left_local;
  
  step = (long)right - (long)left >> 3;
  count = (size_t)key;
  right_local = left;
  while (step != 0) {
    local_30 = step >> 1;
    key_local = (compare_key<tinyusdz::crate::CrateDataTypeId> *)(right_local + local_30);
    bVar1 = less::operator()(&local_31,(element<tinyusdz::crate::CrateDataTypeId,_bool> *)key_local,
                             (compare_key<tinyusdz::crate::CrateDataTypeId> *)count);
    if (bVar1) {
      right_local = (element<tinyusdz::crate::CrateDataTypeId,_bool> *)(key_local + 2);
      step = step - (local_30 + 1);
    }
    else {
      step = local_30;
    }
  }
  return right_local;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}